

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

int __thiscall QFileDialog::open(QFileDialog *this,char *__file,int __oflag,...)

{
  FileMode FVar1;
  QFileDialogPrivate *pQVar2;
  char *pcVar3;
  int __oflag_00;
  long in_FS_OFFSET;
  char *signal;
  QFileDialogPrivate *d;
  QObject *p;
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QFileDialog *)0x7545d4);
  FVar1 = fileMode(this);
  pcVar3 = "2fileSelected(QString)";
  if (FVar1 == ExistingFiles) {
    pcVar3 = "2filesSelected(QStringList)";
  }
  p = local_10;
  QObject::connect(p,(char *)this,(QObject *)pcVar3,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)p);
  QByteArray::operator=(&pQVar2->signalToDisconnectOnClose,pcVar3);
  QPointer<QObject>::operator=((QPointer<QObject> *)this,p);
  QByteArray::operator=(&pQVar2->memberToDisconnectOnClose,___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::open(QObject *receiver, const char *member)
{
    Q_D(QFileDialog);
    const char *signal = (fileMode() == ExistingFiles) ? SIGNAL(filesSelected(QStringList))
                                                       : SIGNAL(fileSelected(QString));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;

    QDialog::open();
}